

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O0

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
ParticleArrayTest_Assignment_Test
          (ParticleArrayTest_Assignment_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_> *in_RDI;
  
  ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::ParticleArrayTest
            (in_RDI);
  (in_RDI->super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>).super_BaseFixture.
  super_Test._vptr_Test = (_func_int **)&PTR__ParticleArrayTest_Assignment_Test_002af7e0;
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}